

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2FullMatchAnchored(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_d00;
  LogMessage local_b80;
  int *local_a00;
  RE2 local_9f8;
  StringPiece local_918;
  LogMessage local_908;
  LogMessage local_788;
  int *local_608;
  RE2 local_600;
  StringPiece local_520;
  LogMessage local_510;
  int *local_390;
  RE2 local_388;
  StringPiece local_2a8;
  LogMessage local_298;
  int *local_108;
  RE2 local_100;
  StringPiece local_20;
  int local_c [2];
  int i;
  
  StringPiece::StringPiece(&local_20,"x1001");
  RE2::RE2(&local_100,"(\\d+)");
  local_108 = local_c;
  bVar1 = RE2::FullMatch<int*>(&local_20,&local_100,&local_108);
  RE2::~RE2(&local_100);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x390);
    poVar2 = LogMessage::stream(&local_298);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(\"x1001\", \"(\\\\d+)\", &i)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  StringPiece::StringPiece(&local_2a8,"1001x");
  RE2::RE2(&local_388,"(\\d+)");
  local_390 = local_c;
  bVar1 = RE2::FullMatch<int*>(&local_2a8,&local_388,&local_390);
  RE2::~RE2(&local_388);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x391);
    poVar2 = LogMessage::stream(&local_510);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(\"1001x\", \"(\\\\d+)\", &i)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_510);
  }
  StringPiece::StringPiece(&local_520,"x1001");
  RE2::RE2(&local_600,"x(\\d+)");
  local_608 = local_c;
  bVar1 = RE2::FullMatch<int*>(&local_520,&local_600,&local_608);
  RE2::~RE2(&local_600);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_788,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x392);
    poVar2 = LogMessage::stream(&local_788);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"x1001\", \"x(\\\\d+)\", &i)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_788);
  }
  if (local_c[0] != 0x3e9) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_908,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x392);
    poVar2 = LogMessage::stream(&local_908);
    std::operator<<(poVar2,"Check failed: (i) == (1001)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_908);
  }
  StringPiece::StringPiece(&local_918,"1001x");
  RE2::RE2(&local_9f8,"(\\d+)x");
  local_a00 = local_c;
  bVar1 = RE2::FullMatch<int*>(&local_918,&local_9f8,&local_a00);
  RE2::~RE2(&local_9f8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b80,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x393);
    poVar2 = LogMessage::stream(&local_b80);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"1001x\", \"(\\\\d+)x\", &i)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b80);
  }
  if (local_c[0] != 0x3e9) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d00,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x393);
    poVar2 = LogMessage::stream(&local_d00);
    std::operator<<(poVar2,"Check failed: (i) == (1001)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d00);
  }
  return;
}

Assistant:

TEST(RE2, FullMatchAnchored) {
  int i;
  // Check that matching is fully anchored
  CHECK(!RE2::FullMatch("x1001", "(\\d+)",  &i));
  CHECK(!RE2::FullMatch("1001x", "(\\d+)",  &i));
  CHECK(RE2::FullMatch("x1001",  "x(\\d+)", &i)); CHECK_EQ(i, 1001);
  CHECK(RE2::FullMatch("1001x",  "(\\d+)x", &i)); CHECK_EQ(i, 1001);
}